

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  byte bVar1;
  void *pvVar2;
  uchar *opad;
  uchar tmp [64];
  int ret;
  uchar *output_local;
  mbedtls_md_context_t *ctx_local;
  
  tmp[0x3c] = 0x92;
  tmp[0x3d] = 0xff;
  tmp[0x3e] = 0xff;
  tmp[0x3f] = 0xff;
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    pvVar2 = ctx->hmac_ctx;
    bVar1 = ctx->md_info->block_size;
    tmp._60_4_ = mbedtls_md_finish(ctx,(uchar *)&opad);
    ctx_local._4_4_ = tmp._60_4_;
    if (((tmp._60_4_ == 0) &&
        (tmp._60_4_ = mbedtls_md_starts(ctx), ctx_local._4_4_ = tmp._60_4_, tmp._60_4_ == 0)) &&
       ((tmp._60_4_ = mbedtls_md_update(ctx,(uchar *)((long)pvVar2 + (long)(int)(uint)bVar1),
                                        (ulong)ctx->md_info->block_size),
        ctx_local._4_4_ = tmp._60_4_, tmp._60_4_ == 0 &&
        (tmp._60_4_ = mbedtls_md_update(ctx,(uchar *)&opad,(ulong)ctx->md_info->size),
        ctx_local._4_4_ = tmp._60_4_, tmp._60_4_ == 0)))) {
      ctx_local._4_4_ = mbedtls_md_finish(ctx,output);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_hmac_finish( mbedtls_md_context_t *ctx, unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    if( ( ret = mbedtls_md_finish( ctx, tmp ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_update( ctx, opad,
                                   ctx->md_info->block_size ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_update( ctx, tmp,
                                   ctx->md_info->size ) ) != 0 )
        return( ret );
    return( mbedtls_md_finish( ctx, output ) );
}